

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getInfoValue(Highs *this,string *info,HighsInt *value)

{
  InfoStatus IVar1;
  InfoStatus status;
  HighsInt *in_stack_00000128;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_stack_00000130;
  bool in_stack_0000013f;
  string *in_stack_00000140;
  HighsLogOptions *in_stack_00000148;
  undefined4 local_4;
  
  IVar1 = getLocalInfoValue(in_stack_00000148,in_stack_00000140,in_stack_0000013f,in_stack_00000130,
                            in_stack_00000128);
  if (IVar1 == kOk) {
    local_4 = kOk;
  }
  else if (IVar1 == kUnavailable) {
    local_4 = kWarning;
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getInfoValue(const std::string& info,
                                HighsInt& value) const {
  InfoStatus status = getLocalInfoValue(options_.log_options, info, info_.valid,
                                        info_.records, value);
  if (status == InfoStatus::kOk) {
    return HighsStatus::kOk;
  } else if (status == InfoStatus::kUnavailable) {
    return HighsStatus::kWarning;
  } else {
    return HighsStatus::kError;
  }
}